

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O0

void __thiscall amrex::MultiCutFab::setVal(MultiCutFab *this,Real val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  FabArrayBase *in_RDI;
  element_type *in_XMM0_Qa;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box *b;
  Array4<double> *a;
  MFIter mfi;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  MultiCutFab *in_stack_fffffffffffffdf0;
  _Head_base<0UL,_amrex::FabFactory<amrex::CutFab>_*,_false> this_00;
  int local_1f0;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  int iVar9;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar10;
  MFIter *in_stack_fffffffffffffe20;
  undefined1 local_1a4 [36];
  undefined1 local_180 [72];
  undefined1 local_138 [236];
  undefined4 local_4c;
  __uniq_ptr_impl<amrex::FabFactory<amrex::CutFab>,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
  local_48;
  undefined4 local_3c;
  pointer local_38;
  undefined4 local_2c;
  MFIter *local_28;
  undefined4 local_1c;
  __uniq_ptr_impl<amrex::FBData<amrex::CutFab>,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
  local_18;
  undefined4 local_c;
  __uniq_ptr_impl<amrex::FabArray<amrex::CutFab>,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
  local_8;
  
  local_138._96_8_ = in_XMM0_Qa;
  MFIter::MFIter(in_stack_fffffffffffffe20,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (uchar)((uint)in_stack_fffffffffffffe14 >> 0x18));
  while (bVar7 = MFIter::isValid((MFIter *)local_138), bVar7) {
    bVar7 = ok(in_stack_fffffffffffffdf0,
               (MFIter *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    if (bVar7) {
      in_stack_fffffffffffffdf0 = (MultiCutFab *)local_180;
      FabArray<amrex::CutFab>::array<amrex::CutFab,_0>
                ((FabArray<amrex::CutFab> *)local_138,(MFIter *)in_stack_fffffffffffffdf0);
      this_00._M_head_impl = (FabFactory<amrex::CutFab> *)local_1a4;
      local_180._64_8_ = in_stack_fffffffffffffdf0;
      MFIter::fabbox((MFIter *)this_00._M_head_impl);
      local_c = 0;
      iVar1 = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          *)&(this_00._M_head_impl)->_vptr_FabFactory)->_M_t).
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      local_1c = 1;
      iVar2 = *(int *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 *)&(this_00._M_head_impl)->_vptr_FabFactory)->_M_t).
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4)
      ;
      local_138._112_8_ =
           (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
            &(this_00._M_head_impl)->_vptr_FabFactory)->_M_t).
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      local_2c = 2;
      iVar3 = *(int *)(this_00._M_head_impl + 1);
      local_38 = (pointer)((long)(this_00._M_head_impl + 1) + 4);
      local_3c = 0;
      iVar4 = *(int *)local_38;
      local_48._M_t.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::CutFab>_*,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::CutFab>_*,_false>._M_head_impl =
           (tuple<amrex::FabFactory<amrex::CutFab>_*,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
            )((long)(this_00._M_head_impl + 1) + 4);
      local_4c._0_1_ = true;
      local_4c._1_3_ = 0;
      iVar5 = ((IntVect *)(this_00._M_head_impl + 2))->vect[0];
      local_138._152_8_ = *(undefined8 *)local_38;
      local_138._224_8_ = (long)(this_00._M_head_impl + 1) + 4;
      local_138._220_4_ = 2;
      uVar6 = ((IntVect *)(this_00._M_head_impl + 2))->vect[1];
      in_stack_fffffffffffffdec = 0;
      local_1a4._28_8_ = this_00._M_head_impl;
      local_138._120_4_ = iVar3;
      local_138._128_8_ = this_00._M_head_impl;
      local_138._140_4_ = iVar1;
      local_138._144_4_ = iVar2;
      local_138._148_4_ = iVar3;
      local_138._160_4_ = uVar6;
      local_138._168_8_ = this_00._M_head_impl;
      local_138._180_4_ = iVar4;
      local_138._184_4_ = iVar5;
      local_138._188_4_ = uVar6;
      local_28 = (MFIter *)this_00._M_head_impl;
      local_18._M_t.
      super__Tuple_impl<0UL,_amrex::FBData<amrex::CutFab>_*,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
      .super__Head_base<0UL,_amrex::FBData<amrex::CutFab>_*,_false>._M_head_impl =
           (tuple<amrex::FBData<amrex::CutFab>_*,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
            )(tuple<amrex::FBData<amrex::CutFab>_*,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
              )this_00._M_head_impl;
      local_8._M_t.
      super__Tuple_impl<0UL,_amrex::FabArray<amrex::CutFab>_*,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
      .super__Head_base<0UL,_amrex::FabArray<amrex::CutFab>_*,_false>._M_head_impl =
           (tuple<amrex::FabArray<amrex::CutFab>_*,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
            )(tuple<amrex::FabArray<amrex::CutFab>_*,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
              )this_00._M_head_impl;
      while (iVar10 = in_stack_fffffffffffffdec, iVar8 = FabArrayBase::nComp(in_RDI), iVar9 = iVar3,
            in_stack_fffffffffffffdec < iVar8) {
        for (; iVar8 = iVar2, iVar9 <= (int)uVar6; iVar9 = iVar9 + 1) {
          for (; local_1f0 = iVar1, iVar8 <= iVar5; iVar8 = iVar8 + 1) {
            for (; local_1f0 <= iVar4; local_1f0 = local_1f0 + 1) {
              local_138._208_8_ = local_180._64_8_;
              local_138._204_4_ = local_1f0;
              *(undefined8 *)
               (*(long *)local_180._64_8_ +
               ((long)(local_1f0 - *(int *)(local_180._64_8_ + 0x20)) +
                (long)(iVar8 - *(int *)(local_180._64_8_ + 0x24)) *
                (long)*(FabArrayBase **)&((BoxArray *)(local_180._64_8_ + 8))->m_bat +
                (long)(iVar9 - *(int *)(local_180._64_8_ + 0x28)) *
                *(long *)((IntVect *)(local_180._64_8_ + 0x10))->vect +
               (long)iVar10 * *(long *)(local_180._64_8_ + 0x18)) * 8) = local_138._96_8_;
              local_138._192_4_ = iVar10;
              local_138._196_4_ = iVar9;
              local_138._200_4_ = iVar8;
            }
          }
        }
        in_stack_fffffffffffffdec = iVar10 + 1;
      }
    }
    MFIter::operator++((MFIter *)local_138);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void
MultiCutFab::setVal (Real val)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_data); mfi.isValid(); ++mfi)
    {
        if (ok(mfi)) {
            Array4<Real> const& a = m_data.array(mfi);
            Box const& b = mfi.fabbox();
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, m_data.nComp(), i, j, k, n,
            {
                a(i,j,k,n) = val;
            });
        }
    }
}